

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O0

bool __thiscall
glcts::TextureBorderClampSamplingTexture<int,_int>::checkLinear
          (TextureBorderClampSamplingTexture<int,_int> *this,
          vector<int,_std::allocator<int>_> *buffer,GLint layer)

{
  int iVar1;
  uint uVar2;
  GLuint GVar3;
  deUint32 dVar4;
  reference pvVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  MessageBuilder local_678;
  uint local_4f8;
  uint local_4f4;
  GLuint c_3;
  GLuint x_1;
  uint local_370;
  uint local_36c;
  GLuint c_2;
  GLuint x;
  uint local_1e4;
  uint local_1e0;
  GLuint c_1;
  GLuint y_1;
  MessageBuilder local_1d0;
  uint local_4c;
  uint local_48;
  GLuint c;
  GLuint y;
  GLuint outRowWidth;
  GLuint out_components;
  GLuint in_components;
  GLuint index;
  GLuint stepY;
  GLuint stepX;
  GLuint centerY;
  GLuint centerX;
  GLint layer_local;
  vector<int,_std::allocator<int>_> *buffer_local;
  TextureBorderClampSamplingTexture<int,_int> *this_local;
  
  centerY = layer;
  _centerX = buffer;
  buffer_local = (vector<int,_std::allocator<int>_> *)this;
  GVar3 = TestConfiguration<int,_int>::get_width(&this->m_test_configuration);
  stepX = GVar3 >> 1;
  GVar3 = TestConfiguration<int,_int>::get_height(&this->m_test_configuration);
  stepY = GVar3 >> 1;
  GVar3 = TestConfiguration<int,_int>::get_width(&this->m_test_configuration);
  index = GVar3 / 3;
  GVar3 = TestConfiguration<int,_int>::get_height(&this->m_test_configuration);
  in_components = GVar3 / 3;
  out_components = 0;
  outRowWidth = TestConfiguration<int,_int>::get_n_in_components(&this->m_test_configuration);
  y = TestConfiguration<int,_int>::get_n_out_components(&this->m_test_configuration);
  GVar3 = TestConfiguration<int,_int>::get_width(&this->m_test_configuration);
  c = GVar3 * y;
  local_48 = stepY;
  do {
    if (stepY + in_components <= local_48) {
      for (local_1e0 = stepY; stepY - in_components < local_1e0; local_1e0 = local_1e0 - 1) {
        for (local_1e4 = 0; uVar2 = local_1e4, dVar4 = deMinu32(y,outRowWidth), uVar2 < dVar4;
            local_1e4 = local_1e4 + 1) {
          out_components = local_1e0 * c + stepX * y + local_1e4;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (_centerX,(ulong)(out_components - c));
          iVar1 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (_centerX,(ulong)out_components);
          if (iVar1 - *pvVar5 < 0) {
            pTVar6 = tcu::TestContext::getLog
                               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<
                      ((MessageBuilder *)&c_2,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar7 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)&c_2,(char (*) [12])"For layer (");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&centerY);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (pMVar7,(char (*) [45])") when moving from center point  (x, y)  = ("
                               );
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stepX);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c6b075);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stepY);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])") to the top\n");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [21])"at point (x, y)  = (");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stepX);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c6b075);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1e0);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (pMVar7,(char (*) [56])
                                       ")- texel values stopped to be monotonically increasing\n");
            tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&c_2);
            return false;
          }
        }
      }
      for (local_36c = stepX; local_36c < stepX + index; local_36c = local_36c + 1) {
        for (local_370 = 0; uVar2 = local_370, dVar4 = deMinu32(y,outRowWidth), uVar2 < dVar4;
            local_370 = local_370 + 1) {
          out_components = stepY + local_36c * y + local_370;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (_centerX,(ulong)(out_components + y));
          iVar1 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (_centerX,(ulong)out_components);
          if (iVar1 - *pvVar5 < 0) {
            pTVar6 = tcu::TestContext::getLog
                               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<
                      ((MessageBuilder *)&c_3,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar7 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)&c_3,(char (*) [12])"For layer (");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&centerY);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (pMVar7,(char (*) [44])") when moving from center point  (x, y) = (")
            ;
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stepX);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c6b075);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stepY);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [16])") to the right\n");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [21])"at point (x, y)  = (");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_36c);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c6b075);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stepY);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (pMVar7,(char (*) [56])
                                       ")- texel values stopped to be monotonically increasing\n");
            tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&c_3);
            return false;
          }
        }
      }
      local_4f4 = stepY;
      do {
        if (local_4f4 <= stepX - index) {
          return true;
        }
        for (local_4f8 = 0; uVar2 = local_4f8, dVar4 = deMinu32(y,outRowWidth), uVar2 < dVar4;
            local_4f8 = local_4f8 + 1) {
          out_components = stepY + local_4f4 * y + local_4f8;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (_centerX,(ulong)(out_components - y));
          iVar1 = *pvVar5;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (_centerX,(ulong)out_components);
          if (iVar1 - *pvVar5 < 0) {
            pTVar6 = tcu::TestContext::getLog
                               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_678,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar7 = tcu::MessageBuilder::operator<<(&local_678,(char (*) [12])"For layer (");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&centerY);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (pMVar7,(char (*) [44])") when moving from center point  (x, y) = (")
            ;
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stepX);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c6b075);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stepY);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [15])") to the left\n");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [21])"at point (x, y)  = (");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_4f4);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c6b075);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stepY);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (pMVar7,(char (*) [56])
                                       ")- texel values stopped to be monotonically increasing\n");
            tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_678);
            return false;
          }
        }
        local_4f4 = local_4f4 - 1;
      } while( true );
    }
    for (local_4c = 0; uVar2 = local_4c, dVar4 = deMinu32(y,outRowWidth), uVar2 < dVar4;
        local_4c = local_4c + 1) {
      out_components = local_48 * c + stepX * y + local_4c;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (_centerX,(ulong)(out_components + c));
      iVar1 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](_centerX,(ulong)out_components);
      if (iVar1 - *pvVar5 < 0) {
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1d0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [12])"For layer (");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)&centerY);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [45])") when moving from center point  (x, y)  = (");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stepX);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c6b075);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stepY);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])") to the bottom\n");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [21])"at point (x, y)  = (");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stepX);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c6b075);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_48);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [57])
                                   ") - texel values stopped to be monotonically increasing\n");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1d0);
        return false;
      }
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

bool TextureBorderClampSamplingTexture<InputType, OutputType>::checkLinear(std::vector<OutputType>& buffer,
																		   glw::GLint layer)
{
	glw::GLuint centerX = m_test_configuration.get_width() / 2;
	glw::GLuint centerY = m_test_configuration.get_height() / 2;
	glw::GLuint stepX   = m_test_configuration.get_width() / 3;
	glw::GLuint stepY   = m_test_configuration.get_height() / 3;

	glw::GLuint index = 0;

	glw::GLuint in_components  = m_test_configuration.get_n_in_components();
	glw::GLuint out_components = m_test_configuration.get_n_out_components();
	glw::GLuint outRowWidth	= m_test_configuration.get_width() * out_components;

	/* Check values from center to the bottom */
	for (glw::GLuint y = centerY; y < centerY + stepY; ++y)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = y * outRowWidth + centerX * out_components + c;
			if (buffer[index + outRowWidth] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y)  = (" << centerX << "," << centerY
								   << ") to the bottom\n"
								   << "at point (x, y)  = (" << centerX << "," << y
								   << ") - texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	/* Check values from center to the top */
	for (glw::GLuint y = centerY; y > centerY - stepY; --y)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = y * outRowWidth + centerX * out_components + c;
			if (buffer[index - outRowWidth] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y)  = (" << centerX << "," << centerY
								   << ") to the top\n"
								   << "at point (x, y)  = (" << centerX << "," << y
								   << ")- texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	/* Check values from center to the right */
	for (glw::GLuint x = centerX; x < centerX + stepX; ++x)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = centerY + x * out_components + c;
			if (buffer[index + out_components] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y) = (" << centerX << "," << centerY
								   << ") to the right\n"
								   << "at point (x, y)  = (" << x << "," << centerY
								   << ")- texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	/* Check values from center to the left */
	for (glw::GLuint x = centerY; x > centerX - stepX; --x)
	{
		for (glw::GLuint c = 0; c < deMinu32(out_components, in_components); ++c)
		{
			index = centerY + x * out_components + c;
			if (buffer[index - out_components] - buffer[index] < 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "For layer (" << layer
								   << ") when moving from center point  (x, y) = (" << centerX << "," << centerY
								   << ") to the left\n"
								   << "at point (x, y)  = (" << x << "," << centerY
								   << ")- texel values stopped to be monotonically increasing\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	return true;
}